

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_range_compression.cc
# Opt level: O0

bool __thiscall
sptk::DynamicRangeCompression::Run
          (DynamicRangeCompression *this,double input,double *output,Buffer *buffer)

{
  double *pdVar1;
  long in_RDX;
  double *in_RSI;
  double in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double g;
  double y1_1;
  double y1;
  double xl;
  double yl;
  double x;
  double t2;
  double t1;
  double yg;
  double xg;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  long local_28;
  double *local_20;
  double local_18;
  bool local_1;
  
  if ((((*(byte *)((long)in_RDI + 0x60) & 1) == 0) || (in_RSI == (double *)0x0)) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    local_28 = in_RDX;
    local_20 = in_RSI;
    local_18 = in_XMM0_Qa;
    local_30 = FloorLog10(in_RDI);
    local_30 = local_30 * 20.0;
    local_40 = *(double *)((long)in_RDI + 0x28) * -0.5 + *(double *)((long)in_RDI + 0x18);
    local_48 = local_40 + *(double *)((long)in_RDI + 0x28);
    local_38 = local_30;
    if (local_40 < local_30) {
      if (local_30 < local_48) {
        local_50 = local_30 - local_40;
        local_38 = local_30 +
                   ((1.0 / *(double *)((long)in_RDI + 0x20) - 1.0) * local_50 * local_50) /
                   (*(double *)((long)in_RDI + 0x28) * 2.0);
      }
      else {
        local_38 = *(double *)((long)in_RDI + 0x18) +
                   (local_30 - *(double *)((long)in_RDI + 0x18)) / *(double *)((long)in_RDI + 0x20);
      }
    }
    local_60 = local_30 - local_38;
    switch(*(undefined4 *)((long)in_RDI + 0x48)) {
    case 0:
      if (local_60 <= *(double *)(local_28 + 0x10)) {
        local_58 = *(double *)((long)in_RDI + 0x58) * *(double *)(local_28 + 0x10);
      }
      else {
        local_58 = anon_unknown.dwarf_3d69::WeightedSum
                             (*(double *)((long)in_RDI + 0x50),*(double *)(local_28 + 0x10),local_60
                             );
      }
      break;
    case 1:
      local_70 = *(double *)((long)in_RDI + 0x58) * *(double *)(local_28 + 8);
      pdVar1 = std::max<double>(&local_60,&local_70);
      local_68 = *pdVar1;
      local_58 = anon_unknown.dwarf_3d69::WeightedSum
                           (*(double *)((long)in_RDI + 0x50),*(double *)(local_28 + 0x10),local_68);
      *(double *)(local_28 + 8) = local_68;
      break;
    case 2:
      if (local_60 <= *(double *)(local_28 + 0x10)) {
        local_58 = anon_unknown.dwarf_3d69::WeightedSum
                             (*(double *)((long)in_RDI + 0x58),*(double *)(local_28 + 0x10),local_60
                             );
      }
      else {
        local_58 = anon_unknown.dwarf_3d69::WeightedSum
                             (*(double *)((long)in_RDI + 0x50),*(double *)(local_28 + 0x10),local_60
                             );
      }
      break;
    case 3:
      local_80 = anon_unknown.dwarf_3d69::WeightedSum
                           (*(double *)((long)in_RDI + 0x58),*(double *)(local_28 + 8),local_60);
      pdVar1 = std::max<double>(&local_60,&local_80);
      local_78 = *pdVar1;
      local_58 = anon_unknown.dwarf_3d69::WeightedSum
                           (*(double *)((long)in_RDI + 0x50),*(double *)(local_28 + 0x10),local_78);
      *(double *)(local_28 + 8) = local_78;
      break;
    default:
      return false;
    }
    *(double *)(local_28 + 0x10) = local_58;
    dVar2 = pow(10.0,(*(double *)((long)in_RDI + 0x40) - local_58) * 0.05);
    *local_20 = local_18 * dVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DynamicRangeCompression::Run(
    const double input, double* output,
    DynamicRangeCompression::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Convert to decibels.
  const double xg(20.0 * sptk::FloorLog10(std::fabs(input / abs_max_value_)));

  // Gain computer.
  double yg;
  {
    const double t1(threshold_ - 0.5 * knee_width_);
    const double t2(t1 + knee_width_);
    if (xg <= t1) {
      yg = xg;
    } else if (t2 <= xg) {
      yg = threshold_ + (xg - threshold_) / ratio_;
    } else {
      const double x(xg - t1);
      yg = xg + (1.0 / ratio_ - 1) * x * x / (2.0 * knee_width_);
    }
  }

  // Level detector.
  double yl;
  {
    const double xl(xg - yg);
    switch (detector_type_) {
      case kBranching: {
        if (buffer->prev_yl < xl) {
          yl = WeightedSum(alpha_a_, buffer->prev_yl, xl);
        } else {
          yl = alpha_r_ * buffer->prev_yl;
        }
        break;
      }
      case kDecoupled: {
        const double y1(std::max(xl, alpha_r_ * buffer->prev_y1));
        yl = WeightedSum(alpha_a_, buffer->prev_yl, y1);
        buffer->prev_y1 = y1;
        break;
      }
      case kBranchingSmooth: {
        if (buffer->prev_yl < xl) {
          yl = WeightedSum(alpha_a_, buffer->prev_yl, xl);
        } else {
          yl = WeightedSum(alpha_r_, buffer->prev_yl, xl);
        }
        break;
      }
      case kDecoupledSmooth: {
        const double y1(
            std::max(xl, WeightedSum(alpha_r_, buffer->prev_y1, xl)));
        yl = WeightedSum(alpha_a_, buffer->prev_yl, y1);
        buffer->prev_y1 = y1;
        break;
      }
      default: {
        return false;
      }
    }
    buffer->prev_yl = yl;
  }

  // Compress input.
  const double g(std::pow(10.0, 0.05 * (makeup_gain_ - yl)));
  *output = input * g;

  return true;
}